

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader.h
# Opt level: O2

int duckdb_brotli::SafeDecodeSymbol(HuffmanCode *table,BrotliBitReader *br,uint64_t *result)

{
  HuffmanCode *pHVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = br->bit_pos_;
  if (uVar2 == 0) {
    if (table->bits != '\0') {
      return 0;
    }
  }
  else {
    uVar3 = br->val_;
    table = table + (uVar3 & 0xff);
    uVar4 = (ulong)table->bits;
    if (uVar4 < 9) {
      if (uVar2 < uVar4) {
        return 0;
      }
    }
    else {
      if (uVar2 < 9) {
        return 0;
      }
      uVar4 = (*(ulong *)(kBrotliBitMask + uVar4 * 8) & uVar3) >> 8;
      pHVar1 = table + uVar4 + table->value;
      if (uVar2 - 8 < (ulong)pHVar1->bits) {
        return 0;
      }
      table = table + uVar4 + table->value;
      uVar4 = (ulong)pHVar1->bits + 8;
    }
    br->bit_pos_ = uVar2 - uVar4;
    br->val_ = uVar3 >> ((byte)uVar4 & 0x3f);
  }
  *result = (ulong)table->value;
  return 1;
}

Assistant:

static BROTLI_INLINE brotli_reg_t BrotliGetAvailableBits(
    const BrotliBitReader* br) {
  return br->bit_pos_;
}